

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lowdiscrepancy.cpp
# Opt level: O0

vector<pbrt::DigitPermutation,_pstd::pmr::polymorphic_allocator<pbrt::DigitPermutation>_> *
pbrt::ComputeRadicalInversePermutations(uint32_t seed,Allocator alloc)

{
  vector<pbrt::DigitPermutation,_pstd::pmr::polymorphic_allocator<pbrt::DigitPermutation>_> *pvVar1;
  vector<pbrt::DigitPermutation,_pstd::pmr::polymorphic_allocator<pbrt::DigitPermutation>_> *perms;
  polymorphic_allocator<std::byte> *in_stack_ffffffffffffff98;
  function<void_(long)> *in_stack_ffffffffffffffa0;
  size_type in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  function<void_(long)> *in_stack_ffffffffffffffd0;
  int64_t in_stack_ffffffffffffffd8;
  int64_t in_stack_ffffffffffffffe0;
  
  pvVar1 = pstd::pmr::polymorphic_allocator<std::byte>::
           new_object<pstd::vector<pbrt::DigitPermutation,pstd::pmr::polymorphic_allocator<pbrt::DigitPermutation>>,pstd::pmr::polymorphic_allocator<std::byte>&>
                     ((polymorphic_allocator<std::byte> *)in_stack_ffffffffffffffa0,
                      in_stack_ffffffffffffff98);
  pstd::vector<pbrt::DigitPermutation,_pstd::pmr::polymorphic_allocator<pbrt::DigitPermutation>_>::
  resize((vector<pbrt::DigitPermutation,_pstd::pmr::polymorphic_allocator<pbrt::DigitPermutation>_>
          *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffb8)
  ;
  std::function<void(long)>::
  function<pbrt::ComputeRadicalInversePermutations(unsigned_int,pstd::pmr::polymorphic_allocator<std::byte>)::__0,void>
            (in_stack_ffffffffffffffa0,(anon_class_24_3_a5378ff6 *)&stack0xffffffffffffffc8);
  ParallelFor(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  std::function<void_(long)>::~function((function<void_(long)> *)0x6fce85);
  return pvVar1;
}

Assistant:

pstd::vector<DigitPermutation> *ComputeRadicalInversePermutations(uint32_t seed,
                                                                  Allocator alloc) {
    pstd::vector<DigitPermutation> *perms =
        alloc.new_object<pstd::vector<DigitPermutation>>(alloc);
    perms->resize(PrimeTableSize);
    ParallelFor(0, PrimeTableSize, [&perms, &alloc, seed](int64_t i) {
        (*perms)[i] = DigitPermutation(Primes[i], seed, alloc);
    });
    return perms;
}